

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O1

void __thiscall
cfgfile::tag_scalar_t<int,_cfgfile::qstring_trait_t>::on_finish
          (tag_scalar_t<int,_cfgfile::qstring_trait_t> *this,
          parser_info_t<cfgfile::qstring_trait_t> *info)

{
  undefined8 *puVar1;
  tag_t<cfgfile::qstring_trait_t> *this_00;
  char16_t *pcVar2;
  qsizetype qVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  logic_error *plVar8;
  undefined8 *puVar9;
  string local_248;
  qstring_wrapper_t local_228;
  qstring_wrapper_t local_208;
  string_t local_1e8;
  string_t local_1d0;
  qstring_wrapper_t local_1b8;
  qstring_wrapper_t local_1a0;
  qstring_wrapper_t local_188;
  qstring_wrapper_t local_170;
  qstring_wrapper_t local_158;
  qstring_wrapper_t local_140;
  qstring_wrapper_t local_128;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string_t local_90;
  string_t local_78;
  string_t local_60;
  string_t local_48;
  
  if ((this->super_tag_t<cfgfile::qstring_trait_t>).m_is_defined == false) {
    plVar8 = (logic_error *)__cxa_allocate_exception(0x28);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Undefined value of tag: \"","");
    qstring_trait_t::from_ascii(&local_188,&local_b0);
    operator+(&local_170,&local_188,&(this->super_tag_t<cfgfile::qstring_trait_t>).m_name);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"\". In file \"","");
    qstring_trait_t::from_ascii(&local_1a0,&local_d0);
    operator+(&local_158,&local_170,&local_1a0);
    operator+(&local_140,&local_158,&info->m_file_name);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"\" on line ","");
    qstring_trait_t::from_ascii(&local_1b8,&local_f0);
    operator+(&local_128,&local_140,&local_1b8);
    qstring_trait_t::to_string(&local_1d0,info->m_line_number);
    operator+((qstring_wrapper_t *)&local_110,&local_128,&local_1d0);
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,".","");
    qstring_trait_t::from_ascii(&local_1e8,&local_248);
    operator+(&local_208,(qstring_wrapper_t *)&local_110,&local_1e8);
    std::logic_error::logic_error(plVar8,"Please use desc() method of the exception.");
    *(undefined ***)plVar8 = &PTR__exception_t_00122a28;
    *(undefined8 *)(plVar8 + 0x10) = 0;
    *(undefined8 *)(plVar8 + 0x18) = 0;
    *(undefined8 *)(plVar8 + 0x20) = 0;
    pcVar2 = *(char16_t **)(plVar8 + 0x18);
    uVar4 = local_208.m_str.d.d._0_4_;
    uVar5 = local_208.m_str.d.d._4_4_;
    local_208.m_str.d.d = (Data *)0x0;
    *(undefined4 *)(plVar8 + 0x10) = uVar4;
    *(undefined4 *)(plVar8 + 0x14) = uVar5;
    *(undefined4 *)(plVar8 + 0x18) = local_208.m_str.d.ptr._0_4_;
    *(undefined4 *)(plVar8 + 0x1c) = local_208.m_str.d.ptr._4_4_;
    qVar3 = *(qsizetype *)(plVar8 + 0x20);
    *(qsizetype *)(plVar8 + 0x20) = local_208.m_str.d.size;
    local_208.m_str.d.ptr = pcVar2;
    local_208.m_str.d.size = qVar3;
    __cxa_throw(plVar8,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                exception_t<cfgfile::qstring_trait_t>::~exception_t);
  }
  iVar7 = (*(this->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t[2])(this);
  puVar9 = *(undefined8 **)CONCAT44(extraout_var,iVar7);
  puVar1 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var,iVar7))[1];
  do {
    if (puVar9 == puVar1) {
      return;
    }
    this_00 = (tag_t<cfgfile::qstring_trait_t> *)*puVar9;
    if (this_00->m_is_mandatory == true) {
      bVar6 = tag_t<cfgfile::qstring_trait_t>::is_defined(this_00);
      if (!bVar6) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x28);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Undefined child mandatory tag: \"","");
        qstring_trait_t::from_ascii(&local_1d0,&local_b0);
        operator+(&local_1b8,&local_1d0,&this_00->m_name);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"\". Where parent is: \"","");
        qstring_trait_t::from_ascii(&local_1e8,&local_d0);
        operator+(&local_1a0,&local_1b8,&local_1e8);
        operator+(&local_188,&local_1a0,&(this->super_tag_t<cfgfile::qstring_trait_t>).m_name);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"\". In file \"","");
        qstring_trait_t::from_ascii(&local_48,&local_f0);
        operator+(&local_170,&local_188,&local_48);
        operator+(&local_158,&local_170,&info->m_file_name);
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"\" on line ","");
        qstring_trait_t::from_ascii(&local_60,&local_248);
        operator+(&local_140,&local_158,&local_60);
        qstring_trait_t::to_string(&local_78,info->m_line_number);
        operator+(&local_128,&local_140,&local_78);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,".","");
        qstring_trait_t::from_ascii(&local_90,&local_110);
        operator+(&local_228,&local_128,&local_90);
        std::logic_error::logic_error(plVar8,"Please use desc() method of the exception.");
        *(undefined ***)plVar8 = &PTR__exception_t_00122a28;
        *(undefined8 *)(plVar8 + 0x10) = 0;
        *(undefined8 *)(plVar8 + 0x18) = 0;
        *(undefined8 *)(plVar8 + 0x20) = 0;
        pcVar2 = *(char16_t **)(plVar8 + 0x18);
        uVar4 = local_228.m_str.d.d._0_4_;
        uVar5 = local_228.m_str.d.d._4_4_;
        local_228.m_str.d.d = (Data *)0x0;
        *(undefined4 *)(plVar8 + 0x10) = uVar4;
        *(undefined4 *)(plVar8 + 0x14) = uVar5;
        *(undefined4 *)(plVar8 + 0x18) = local_228.m_str.d.ptr._0_4_;
        *(undefined4 *)(plVar8 + 0x1c) = local_228.m_str.d.ptr._4_4_;
        qVar3 = *(qsizetype *)(plVar8 + 0x20);
        *(qsizetype *)(plVar8 + 0x20) = local_228.m_str.d.size;
        local_228.m_str.d.ptr = pcVar2;
        local_228.m_str.d.size = qVar3;
        __cxa_throw(plVar8,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                    exception_t<cfgfile::qstring_trait_t>::~exception_t);
      }
    }
    puVar9 = puVar9 + 1;
  } while( true );
}

Assistant:

void on_finish( const parser_info_t< Trait > & info ) override
	{
		if( !this->is_defined_member_value() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Undefined value of tag: \"" ) +
				this->name() + Trait::from_ascii( "\". In file \"" ) +
				info.file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		for( const tag_t< Trait > * tag : this->children() )
		{
			if( tag->is_mandatory() && !tag->is_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Undefined child mandatory tag: \"" ) +
					tag->name() + Trait::from_ascii( "\". Where parent is: \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() +
					Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}
	}